

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Mat6x6d * __thiscall
OpenMD::HydroProp::getDiffusionTensorAtPos(HydroProp *this,Vector3d *pos,RealType temperature)

{
  SquareMatrix<double,_6> *in_RDX;
  Vector3<double> *in_RSI;
  Mat6x6d *in_RDI;
  Mat3x3d Dposrr;
  Mat3x3d Dpostr;
  Mat3x3d Dpostt;
  Mat3x3d Drr;
  Mat3x3d Dtr;
  Mat3x3d Dtt;
  Mat6x6d D;
  Mat3x3d U;
  Vector3d cp;
  Mat6x6d *Dpos;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff888;
  Mat6x6d *m;
  RectMatrix<double,_6U,_6U> *this_00;
  RectMatrix<double,_3U,_3U> *m1;
  RectMatrix<double,_3U,_3U> local_6a8;
  RealType in_stack_fffffffffffff9d0;
  HydroProp *in_stack_fffffffffffff9d8;
  RectMatrix<double,_3U,_3U> local_4b0;
  RectMatrix<double,_3U,_3U> local_468;
  RectMatrix<double,_3U,_3U> local_420 [13];
  undefined1 local_50 [80];
  
  this_00 = (RectMatrix<double,_6U,_6U> *)local_50;
  m = in_RDI;
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_RDX);
  m1 = (RectMatrix<double,_3U,_3U> *)(local_50 + 0x18);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_RDX,(Vector<double,_3U> *)in_stack_fffffffffffff888);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392e19);
  Vector3<double>::Vector3((Vector3<double> *)in_RDX,(Vector3<double> *)in_stack_fffffffffffff888);
  SquareMatrix3<double>::setupSkewMat((SquareMatrix3<double> *)this_00,in_RSI);
  getDiffusionTensor(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392e6e);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392e7d);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392e8c);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392ef2);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392f01);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x392f10);
  OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_00);
  OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_00);
  OpenMD::operator-(m1,(RectMatrix<double,_3U,_3U> *)this_00);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)m1);
  OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_00);
  OpenMD::operator+(m1,(RectMatrix<double,_3U,_3U> *)this_00);
  OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_00);
  OpenMD::operator-(m1,(RectMatrix<double,_3U,_3U> *)this_00);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)in_RDX,in_stack_fffffffffffff888)
  ;
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_RDI,(SquareMatrix<double,_3> *)in_RDX);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x39303d);
  RectMatrix<double,_3U,_3U>::~RectMatrix(local_420);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x393057);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_468);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x393071);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x39307e);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_4b0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x393098);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3930a5);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_RDX,(SquareMatrix3<double> *)in_stack_fffffffffffff888);
  OpenMD::operator*((SquareMatrix3<double> *)m1,(SquareMatrix3<double> *)this_00);
  OpenMD::operator+(m1,(RectMatrix<double,_3U,_3U> *)this_00);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)in_RDX,in_stack_fffffffffffff888)
  ;
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_RDI,(SquareMatrix<double,_3> *)in_RDX);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x393135);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_6a8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x39314f);
  SquareMatrix<double,_6>::SquareMatrix(in_RDX);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)m1);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3931b1);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,(SquareMatrix3<double> *)m);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3934d3);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3934e0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3934ed);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3934fa);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x393507);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x393514);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x393521);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x39352e);
  return m;
}

Assistant:

Mat6x6d HydroProp::getDiffusionTensorAtPos(Vector3d pos,
                                             RealType temperature) {
    // Vector from reference point to center of resistance  = cor_
    // Vector from reference point to new location = pos
    // Vector from center of resistance to new location = pos - cor_

    Vector3d cp = pos - cor_;
    Mat3x3d U;
    U.setupSkewMat(cp);

    Mat6x6d D = getDiffusionTensor(temperature);

    Mat3x3d Dtt;
    Mat3x3d Dtr;
    Mat3x3d Drr;

    D.getSubMatrix(0, 0, Dtt);
    D.getSubMatrix(3, 0, Dtr);
    D.getSubMatrix(3, 3, Drr);

    // calculate Diffusion Tensor at new location
    Mat3x3d Dpostt;  // translational diffusion tensor at new location
    Mat3x3d Dpostr;  // rotational diffusion tensor at new location
    Mat3x3d Dposrr;  // translation-rotation coupling diffusion tensor
                     // at new location

    Dpostt = Dtt - U * Drr * U + Dtr.transpose() * U - U * Dtr;
    Dposrr = Drr;
    Dpostr = Dtr + Drr * U;

    Mat6x6d Dpos;
    Dpos.setSubMatrix(0, 0, Dpostt);
    Dpos.setSubMatrix(0, 3, Dpostr.transpose());
    Dpos.setSubMatrix(3, 0, Dpostr);
    Dpos.setSubMatrix(3, 3, Dposrr);
    return Dpos;
  }